

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall preciseunitOps_equality1_Test::TestBody(preciseunitOps_equality1_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  char *pcVar2;
  double dVar3;
  precise_unit u2;
  precise_unit u1;
  int eqFailNeg;
  int eqFailPos;
  precise_unit u3;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  int local_48;
  int local_44;
  undefined1 local_40 [16];
  double local_30;
  double local_28;
  
  local_44 = 0;
  local_48 = 0;
  local_30 = 1.0;
  do {
    dVar3 = 0.0;
    do {
      local_58 = (undefined1  [8])local_30;
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_000039d2;
      local_68._0_8_ = local_30 + dVar3;
      local_68._8_8_ = &DAT_000039d2;
      local_40._0_8_ = local_30 - dVar3;
      local_40._8_8_ = &DAT_000039d2;
      local_28 = dVar3;
      bVar1 = units::precise_unit::operator==((precise_unit *)local_58,(precise_unit *)local_68);
      if (!bVar1) {
        local_44 = local_44 + 1;
      }
      bVar1 = units::precise_unit::operator==((precise_unit *)local_58,(precise_unit *)local_40);
      if (!bVar1) {
        local_48 = local_48 + 1;
      }
      dVar3 = local_28 + 1e-15;
    } while (dVar3 < 5e-13);
    local_30 = local_30 + 1e-15;
  } while (local_30 < 1.000000000002);
  local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_58,"eqFailPos","0",&local_44,(int *)local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x2d9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_40,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._0_8_ + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_58,"eqFailNeg","0",&local_48,(int *)local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x2da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_40,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._0_8_ + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  return;
}

Assistant:

TEST(preciseunitOps, equality1)
{
    int eqFailPos = 0;
    int eqFailNeg = 0;
    double start = 1.0;
    while (start < (1.0 + 2e-12)) {
        double diff = 0.0;
        while (diff < 5e-13) {
            auto u1 = precise_unit(start, precise::V);
            auto u2 = precise_unit(start + diff, precise::V);
            auto u3 = precise_unit(start - diff, precise::V);
            if (u1 != u2) {
                ++eqFailPos;
            }
            if (u1 != u3) {
                ++eqFailNeg;
            }
            diff += 1e-15;
        }
        start += 1e-15;
    }
    EXPECT_EQ(eqFailPos, 0);
    EXPECT_EQ(eqFailNeg, 0);
}